

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::AddTracedSources
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs)

{
  ulong uVar1;
  cmTargetInternals *pcVar2;
  cmCompiledGeneratorExpression *this_00;
  TargetPropertyEntry *this_01;
  auto_ptr<cmCompiledGeneratorExpression> local_a8;
  TargetPropertyEntry *local_a0;
  cmGeneratorExpression local_98;
  cmCompiledGeneratorExpression *local_90;
  auto_ptr<cmCompiledGeneratorExpression> local_88;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  undefined1 local_38 [8];
  string srcFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *srcs_local;
  cmTarget *this_local;
  
  srcFiles.field_2._8_8_ = srcs;
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)local_38,srcs,";");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
    ::clear(&pcVar2->SourceFilesMap);
    this->LinkImplementationLanguageIsContextDependent = true;
    cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge,this->Makefile);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)&cge,(cmListFileBacktrace *)&ge);
    cmGeneratorExpression::Parse(&local_98,(string *)&cge);
    local_90 = (cmCompiledGeneratorExpression *)
               cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_98);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              (&local_88,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_90);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_98);
    this_00 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_88);
    cmCompiledGeneratorExpression::SetEvaluateForBuildsystem(this_00,true);
    pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
    this_01 = (TargetPropertyEntry *)operator_new(0x10);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_a8,&local_88);
    cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
              (this_01,&local_a8,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
    local_a0 = this_01;
    std::
    vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
    ::push_back(&pcVar2->SourceEntries,&local_a0);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_a8);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_88);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmTarget::AddTracedSources(std::vector<std::string> const& srcs)
{
  std::string srcFiles = cmJoin(srcs, ";");
  if (!srcFiles.empty())
    {
    this->Internal->SourceFilesMap.clear();
    this->LinkImplementationLanguageIsContextDependent = true;
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(srcFiles);
    cge->SetEvaluateForBuildsystem(true);
    this->Internal->SourceEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
}